

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_o1.cc
# Opt level: O0

MatrixXd * __thiscall
lf::geometry::Parallelogram::Global
          (MatrixXd *__return_storage_ptr__,Parallelogram *this,MatrixXd *local)

{
  ConstRowXpr local_860;
  ConstColXpr local_828;
  Product<Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>
  local_7f0;
  ConstRowXpr local_780;
  ConstColXpr local_748;
  Product<Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>
  local_710;
  NestedExpressionType local_6a0;
  ConstRowXpr local_698;
  NestedExpressionType local_660;
  ConstRowXpr local_658;
  int local_61c;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>_>
  local_618;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>_>,_const_Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>_>
  local_5b8;
  MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>_>,_const_Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>_>_>
  local_510;
  ConstColXpr local_468;
  Product<Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>_>,_const_Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>_>_>,_0>
  local_430;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>_>,_const_Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>_>_>,_0>,_const_Eigen::Product<Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>_>
  local_350;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>_>,_const_Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>_>_>,_0>,_const_Eigen::Product<Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>_>,_const_Eigen::Product<Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>_>
  local_1f8;
  MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *local_20;
  MatrixXd *local_local;
  Parallelogram *this_local;
  
  local_20 = (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local;
  local_local = (MatrixXd *)this;
  this_local = (Parallelogram *)__return_storage_ptr__;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>_>::col
            (&local_468,(DenseBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_> *)&this->coords_,0);
  local_61c = 1;
  local_660 = (NestedExpressionType)
              Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::array(local_20);
  Eigen::DenseBase<Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>::row
            (&local_658,
             (DenseBase<Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
             &local_660,0);
  Eigen::operator-(&local_618,&local_61c,(StorageBaseType *)&local_658);
  local_6a0 = (NestedExpressionType)
              Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::array(local_20);
  Eigen::DenseBase<Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>::row
            (&local_698,
             (DenseBase<Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
             &local_6a0,1);
  Eigen::
  ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,-1,1,1,-1>const>const,Eigen::Block<Eigen::ArrayWrapper<Eigen::Matrix<double,-1,-1,0,-1,-1>const>const,1,-1,false>const>>
  ::operator-(&local_5b8,
              (ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,_1,1,1,_1>const>const,Eigen::Block<Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,1,_1,false>const>>
               *)&local_618,
              (ArrayBase<Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>_>
               *)&local_698);
  Eigen::
  ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_1,_-1,_false>_>,_const_Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_1,_-1,_false>_>_>
  ::matrix(&local_510,
           (ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>_>,_const_Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>_>_>
            *)&local_5b8);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,4,0,-1,4>const,-1,1,true>>::operator*
            (&local_430,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,4,0,_1,4>const,_1,1,true>> *)
             &local_468,
             (MatrixBase<Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>_>,_const_Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>_>_>_>
              *)&local_510);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>_>::col
            (&local_748,(DenseBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_> *)&this->coords_,1);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
            (&local_780,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_20,0);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,4,0,-1,4>const,-1,1,true>>::operator*
            (&local_710,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,4,0,_1,4>const,_1,1,true>> *)
             &local_748,
             (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
              *)&local_780);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,-1,4,0,-1,4>const,-1,1,true>,Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,-1,1,1,-1>const>const,Eigen::Block<Eigen::ArrayWrapper<Eigen::Matrix<double,-1,-1,0,-1,-1>const>const,1,-1,false>const>const,Eigen::Block<Eigen::ArrayWrapper<Eigen::Matrix<double,-1,-1,0,-1,-1>const>const,1,-1,false>const>const>,0>>
  ::operator+(&local_350,
              (MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_1,4,0,_1,4>const,_1,1,true>,Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,_1,1,1,_1>const>const,Eigen::Block<Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,1,_1,false>const>const,Eigen::Block<Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,1,_1,false>const>const>,0>>
               *)&local_430,
              (MatrixBase<Eigen::Product<Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>_>
               *)&local_710);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>_>::col
            (&local_828,(DenseBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_> *)&this->coords_,3);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
            (&local_860,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_20,1);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,4,0,-1,4>const,-1,1,true>>::operator*
            (&local_7f0,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,4,0,_1,4>const,_1,1,true>> *)
             &local_828,
             (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
              *)&local_860);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Block<Eigen::Matrix<double,-1,4,0,-1,4>const,-1,1,true>,Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,-1,1,1,-1>const>const,Eigen::Block<Eigen::ArrayWrapper<Eigen::Matrix<double,-1,-1,0,-1,-1>const>const,1,-1,false>const>const,Eigen::Block<Eigen::ArrayWrapper<Eigen::Matrix<double,-1,-1,0,-1,-1>const>const,1,-1,false>const>const>,0>const,Eigen::Product<Eigen::Block<Eigen::Matrix<double,-1,4,0,-1,4>const,-1,1,true>,Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1,-1,false>,0>const>>
  ::operator+(&local_1f8,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Block<Eigen::Matrix<double,_1,4,0,_1,4>const,_1,1,true>,Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,_1,1,1,_1>const>const,Eigen::Block<Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,1,_1,false>const>const,Eigen::Block<Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,1,_1,false>const>const>,0>const,Eigen::Product<Eigen::Block<Eigen::Matrix<double,_1,4,0,_1,4>const,_1,1,true>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>,0>const>>
               *)&local_350,
              (MatrixBase<Eigen::Product<Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>_>
               *)&local_7f0);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Block<Eigen::Matrix<double,_1,4,0,_1,4>const,_1,1,true>,Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,_1,1,1,_1>const>const,Eigen::Block<Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,1,_1,false>const>const,Eigen::Block<Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,1,_1,false>const>const>,0>const,Eigen::Product<Eigen::Block<Eigen::Matrix<double,_1,4,0,_1,4>const,_1,1,true>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>,0>const>const,Eigen::Product<Eigen::Block<Eigen::Matrix<double,_1,4,0,_1,4>const,_1,1,true>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>,0>const>>
            ((Matrix<double,_1,_1,0,_1,_1> *)__return_storage_ptr__,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>_>,_const_Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>_>_>,_0>,_const_Eigen::Product<Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>_>,_const_Eigen::Product<Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>_>_>
              *)&local_1f8);
  return __return_storage_ptr__;
}

Assistant:

Eigen::MatrixXd Parallelogram::Global(const Eigen::MatrixXd& local) const {
  return coords_.col(0) *
             (1 - local.array().row(0) - local.array().row(1)).matrix() +
         coords_.col(1) * local.row(0) + coords_.col(3) * local.row(1);
}